

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

void __thiscall FString::FString(FString *this,char oneChar)

{
  FStringData *pFVar1;
  FStringData *pFVar2;
  
  if (oneChar == '\0') {
    NullString.RefCount = NullString.RefCount + 1;
    pFVar2 = (FStringData *)NullString.Nothing;
  }
  else {
    pFVar1 = FStringData::Alloc(1);
    pFVar2 = pFVar1 + 1;
    pFVar1->Len = 1;
    *(char *)&pFVar1[1].Len = oneChar;
    *(undefined1 *)((long)&pFVar1[1].Len + 1) = 0;
  }
  this->Chars = (char *)pFVar2;
  return;
}

Assistant:

FString::FString (char oneChar)
{
	if (oneChar == '\0')
	{
		NullString.RefCount++;
		Chars = &NullString.Nothing[0];
	}
	else
	{
		AllocBuffer (1);
		Chars[0] = oneChar;
		Chars[1] = '\0';
	}
}